

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_widget.c
# Opt level: O2

void ugui_menu_widget_basic_event_handler(ugui_window_t *window,int event,void *ctx)

{
  int iVar1;
  
  iVar1 = (**(code **)((long)ctx + 0x30))(ctx,0);
  if (event - 4U < 2) {
    if (*(code **)((long)ctx + 0x48) != (code *)0x0) {
      (**(code **)((long)ctx + 0x48))(ctx,*(undefined2 *)((long)ctx + 0x50),0);
      return;
    }
  }
  else if (event == 2) {
    if (*(uint *)((long)ctx + 0x50) < iVar1 - 1U) {
      *(uint *)((long)ctx + 0x50) = *(uint *)((long)ctx + 0x50) + 1;
    }
  }
  else if ((event == 1) && (*(int *)((long)ctx + 0x50) != 0)) {
    *(int *)((long)ctx + 0x50) = *(int *)((long)ctx + 0x50) + -1;
  }
  return;
}

Assistant:

static void ugui_menu_widget_basic_event_handler(ugui_window_t *window, int event, void* ctx) {
	ugui_menu_widget_t* menu_widget = (ugui_menu_widget_t*)ctx;

	int max_rows = menu_widget->data_callbacks.get_num_rows(menu_widget, NULL);

	switch (event) {
	case UGUI_EVT_UP:
		if (menu_widget->selected > 0) menu_widget->selected --;
		break;
	case UGUI_EVT_DOWN:
		if (menu_widget->selected < (max_rows - 1)) menu_widget->selected ++;
		break;
	case UGUI_EVT_RIGHT:
	case UGUI_EVT_SELECT:
		//TODO: select callback
		if(menu_widget->data_callbacks.select != NULL) {
			menu_widget->data_callbacks.select(menu_widget, menu_widget->selected, NULL);
		}
		break;
	}
}